

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_is_blocked(quicly_conn_t *conn)

{
  int iVar1;
  
  iVar1 = 0;
  if (((conn->egress).max_data.permitted <= (conn->egress).max_data.sent) &&
     (iVar1 = 1, (conn->egress).data_blocked == QUICLY_SENDER_STATE_NONE)) {
    (conn->egress).data_blocked = QUICLY_SENDER_STATE_SEND;
    return iVar1;
  }
  return iVar1;
}

Assistant:

int quicly_is_blocked(quicly_conn_t *conn)
{
    if (conn->egress.max_data.sent < conn->egress.max_data.permitted)
        return 0;

    /* schedule the transmission of DATA_BLOCKED frame, if it's new information */
    if (conn->egress.data_blocked == QUICLY_SENDER_STATE_NONE)
        conn->egress.data_blocked = QUICLY_SENDER_STATE_SEND;

    return 1;
}